

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3WalkSelect(Walker *pWalker,Select *p)

{
  SrcList *pSVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Select **ppSVar5;
  
  uVar2 = 0;
  if ((p != (Select *)0x0) &&
     (uVar2 = 0, pWalker->xSelectCallback != (_func_int_Walker_ptr_Select_ptr *)0x0)) {
    pWalker->walkerDepth = pWalker->walkerDepth + 1;
    do {
      if ((pWalker->bSelectDepthFirst == '\0') &&
         (uVar2 = (*pWalker->xSelectCallback)(pWalker,p), uVar2 != 0)) goto LAB_00159dd0;
      iVar3 = sqlite3WalkExprList(pWalker,p->pEList);
      if (((iVar3 != 0) ||
          ((((iVar3 = sqlite3WalkExpr(pWalker,p->pWhere), iVar3 != 0 ||
             (iVar3 = sqlite3WalkExprList(pWalker,p->pGroupBy), iVar3 != 0)) ||
            (iVar3 = sqlite3WalkExpr(pWalker,p->pHaving), iVar3 != 0)) ||
           ((iVar3 = sqlite3WalkExprList(pWalker,p->pOrderBy), iVar3 != 0 ||
            (iVar3 = sqlite3WalkExpr(pWalker,p->pLimit), iVar3 != 0)))))) ||
         (iVar3 = sqlite3WalkExpr(pWalker,p->pOffset), iVar3 != 0)) {
LAB_00159dd8:
        pWalker->walkerDepth = pWalker->walkerDepth + -1;
        return 2;
      }
      pSVar1 = p->pSrc;
      if ((pSVar1 != (SrcList *)0x0) && (0 < pSVar1->nSrc)) {
        ppSVar5 = &pSVar1->a[0].pSelect;
        iVar3 = pSVar1->nSrc + 1;
        do {
          iVar4 = sqlite3WalkSelect(pWalker,*ppSVar5);
          if (iVar4 != 0) goto LAB_00159dd8;
          ppSVar5 = ppSVar5 + 0xd;
          iVar3 = iVar3 + -1;
        } while (1 < iVar3);
      }
      if ((pWalker->bSelectDepthFirst != '\0') &&
         (uVar2 = (*pWalker->xSelectCallback)(pWalker,p), uVar2 != 0)) goto LAB_00159dd0;
      p = p->pPrior;
    } while (p != (Select *)0x0);
    uVar2 = 0;
LAB_00159dd0:
    pWalker->walkerDepth = pWalker->walkerDepth + -1;
    uVar2 = uVar2 & 2;
  }
  return uVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalkSelect(Walker *pWalker, Select *p){
  int rc;
  if( p==0 || pWalker->xSelectCallback==0 ) return WRC_Continue;
  rc = WRC_Continue;
  pWalker->walkerDepth++;
  while( p ){
    if( !pWalker->bSelectDepthFirst ){
       rc = pWalker->xSelectCallback(pWalker, p);
       if( rc ) break;
    }
    if( sqlite3WalkSelectExpr(pWalker, p)
     || sqlite3WalkSelectFrom(pWalker, p)
    ){
      pWalker->walkerDepth--;
      return WRC_Abort;
    }
    if( pWalker->bSelectDepthFirst ){
      rc = pWalker->xSelectCallback(pWalker, p);
      /* Depth-first search is currently only used for
      ** selectAddSubqueryTypeInfo() and that routine always returns
      ** WRC_Continue (0).  So the following branch is never taken. */
      if( NEVER(rc) ) break;
    }
    p = p->pPrior;
  }
  pWalker->walkerDepth--;
  return rc & WRC_Abort;
}